

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tribench.c
# Opt level: O2

void resize(ATimeUs timestamp,uint old_w,uint old_h)

{
  long lVar1;
  
  g.target.viewport.x = 0;
  g.target.viewport.y = 0;
  g.target.viewport.w = a_app_state->width;
  g.target.viewport.h = a_app_state->height;
  g.target.framebuffer = (AGLFramebuffer *)0x0;
  g.projection.X = (AVec4f)ZEXT416((uint)(0.2 / ((float)a_app_state->width / 38000.0)));
  lVar1 = (ulong)(uint)(0.2 / ((float)a_app_state->height / 38000.0)) << 0x20;
  g.projection.Y.x = (float)(int)lVar1;
  g.projection.Y.y = (float)(int)((ulong)lVar1 >> 0x20);
  g.projection.Y.z = 0.0;
  g.projection.Y.w = 0.0;
  g.projection.Z.x = 0.0;
  g.projection.Z.y = 0.0;
  g.projection.Z.z = -1.002002;
  g.projection.Z.w = -1.0;
  g.projection.W.x = 0.0;
  g.projection.W.y = 0.0;
  g.projection.W.z = -0.2002002;
  g.projection.W.w = 0.0;
  return;
}

Assistant:

static void resize(ATimeUs timestamp, unsigned int old_w, unsigned int old_h) {
	(void)(timestamp);
	(void)(old_w);
	(void)(old_h);
	g.target.viewport.x = g.target.viewport.y = 0;
	g.target.viewport.w = a_app_state->width;
	g.target.viewport.h = a_app_state->height;

	g.target.framebuffer = NULL;

	const float dpm = 38e3f; /* ~96 dpi */
	g.projection = aMat4fPerspective(.1f, 100.f, a_app_state->width / dpm, a_app_state->height / dpm);
}